

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

int __thiscall
booster::locale::util::gregorian_calendar::get_value
          (gregorian_calendar *this,period_mark p,value_type v)

{
  int iVar1;
  int iVar2;
  uint in_EDX;
  undefined4 in_ESI;
  gregorian_calendar *in_RDI;
  int val_1;
  int dow_of_end_of_month;
  int end_of_month_days;
  int val;
  int dow_of_end_of_year;
  int end_of_year_days;
  int year;
  
  switch(in_ESI) {
  case 1:
    return 1;
  case 2:
  case 3:
    if (in_EDX < 3) {
      return 1;
    }
    if (in_EDX == 3) {
      return (in_RDI->tm_).tm_year + 0x76c;
    }
    if (in_EDX - 4 < 3) {
      iVar1 = std::numeric_limits<int>::max();
      return iVar1;
    }
    break;
  case 4:
    if (in_EDX < 3) {
      return 0;
    }
    if (in_EDX == 3) {
      return (in_RDI->tm_).tm_mon;
    }
    if (in_EDX - 4 < 3) {
      return 0xb;
    }
    break;
  case 5:
    switch(in_EDX) {
    case 0:
    case 1:
    case 2:
      return 1;
    case 3:
      return (in_RDI->tm_).tm_mday;
    case 4:
      return 0x1c;
    case 5:
      iVar1 = anon_unknown_0::days_in_month(0,0x2a5426);
      return iVar1;
    case 6:
      return 0x1f;
    }
    break;
  case 6:
    switch(in_EDX) {
    case 0:
    case 1:
    case 2:
      return 1;
    case 3:
      return (in_RDI->tm_).tm_yday + 1;
    case 4:
      return 0x16d;
    case 5:
      iVar1 = anon_unknown_0::is_leap((in_RDI->tm_).tm_year + 0x76c);
      if (iVar1 == 0) {
        return 0x16d;
      }
      return 0x16e;
    case 6:
      return 0x16e;
    }
    break;
  case 7:
    if (in_EDX < 3) {
      return 1;
    }
    if (in_EDX == 3) {
      return (in_RDI->tm_).tm_wday + 1;
    }
    if (in_EDX - 4 < 3) {
      return 7;
    }
    break;
  case 9:
    if (in_EDX < 3) {
      return 1;
    }
    if (in_EDX == 3) {
      return (((in_RDI->tm_).tm_wday - in_RDI->first_day_of_week_) + 7) % 7 + 1;
    }
    if (in_EDX - 4 < 3) {
      return 7;
    }
    break;
  case 10:
    if (in_EDX < 3) {
      return 0;
    }
    if (in_EDX == 3) {
      return (in_RDI->tm_).tm_hour;
    }
    if (in_EDX - 4 < 3) {
      return 0x17;
    }
    break;
  case 0xb:
    if (in_EDX < 3) {
      return 0;
    }
    if (in_EDX == 3) {
      return (in_RDI->tm_).tm_hour % 0xc;
    }
    if (in_EDX - 4 < 3) {
      return 0xb;
    }
    break;
  case 0xc:
    if (in_EDX < 3) {
      return 0;
    }
    if (in_EDX == 3) {
      return (uint)(0xb < (in_RDI->tm_).tm_hour);
    }
    if (in_EDX - 4 < 3) {
      return 1;
    }
    break;
  case 0xd:
    if (in_EDX < 3) {
      return 0;
    }
    if (in_EDX == 3) {
      return (in_RDI->tm_).tm_min;
    }
    if (in_EDX - 4 < 3) {
      return 0x3b;
    }
    break;
  case 0xe:
    if (in_EDX < 3) {
      return 0;
    }
    if (in_EDX == 3) {
      return (in_RDI->tm_).tm_sec;
    }
    if (in_EDX - 4 < 3) {
      return 0x3b;
    }
    break;
  case 0xf:
    switch(in_EDX) {
    case 0:
    case 1:
    case 2:
      return 1;
    case 3:
      iVar1 = get_week_number(in_RDI,(in_RDI->tm_).tm_yday,(in_RDI->tm_).tm_wday);
      if (-1 < iVar1) {
        return iVar1;
      }
      return 0x35;
    case 4:
      return 0x34;
    case 5:
      iVar1 = anon_unknown_0::is_leap((in_RDI->tm_).tm_year + 0x76c);
      iVar2 = 0x16d;
      if (iVar1 != 0) {
        iVar2 = 0x16e;
      }
      iVar1 = get_week_number(in_RDI,iVar2 + -1,
                              (((iVar2 + -1) - (in_RDI->tm_).tm_yday) + (in_RDI->tm_).tm_wday) % 7);
      return iVar1;
    case 6:
      return 0x35;
    }
  case 0x10:
    switch(in_EDX) {
    case 0:
    case 1:
    case 2:
      return 1;
    case 3:
      iVar1 = get_week_number(in_RDI,(in_RDI->tm_).tm_mday,(in_RDI->tm_).tm_wday);
      if (-1 < iVar1) {
        return iVar1;
      }
      return 5;
    case 4:
      return 4;
    case 5:
      iVar1 = anon_unknown_0::days_in_month(0,0x2a5962);
      iVar1 = get_week_number(in_RDI,iVar1,
                              ((iVar1 - (in_RDI->tm_).tm_mday) + (in_RDI->tm_).tm_wday) % 7);
      return iVar1;
    case 6:
      return 5;
    }
  case 8:
    switch(in_EDX) {
    case 0:
    case 1:
    case 2:
      return 1;
    case 3:
      return ((in_RDI->tm_).tm_mday + -1) / 7 + 1;
    case 4:
      return 4;
    case 5:
      if (((in_RDI->tm_).tm_mon == 1) &&
         (iVar1 = anon_unknown_0::is_leap((in_RDI->tm_).tm_year + 0x76c), iVar1 == 0)) {
        return 4;
      }
      return 5;
    case 6:
      return 5;
    }
    break;
  case 0x11:
    return in_RDI->first_day_of_week_ + 1;
  }
  return 0;
}

Assistant:

virtual int get_value(period::marks::period_mark p,value_type v) const 
            {
                using namespace period::marks;
                switch(p) {
                case era:
                    return 1;
                case year:
                case extended_year:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        #ifdef BOOSTER_WIN_NATIVE
                        return 1970; // Unix epoch windows can't handle negative time_t
                        #else
                        if(sizeof(std::time_t) == 4)
                            return 1901; // minimal year with 32 bit time_t
                        else
                            return 1; 
                        #endif
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        if(sizeof(std::time_t) == 4)
                            return 2038; // Y2K38 - maximal with 32 bit time_t
                        else
                            return std::numeric_limits<int>::max();
                    case current:
                        return tm_.tm_year + 1900;
                    };
                    break;
                case month:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 11;
                    case current:
                        return tm_.tm_mon;
                    };
                    break;
                case day:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 31;
                    case least_maximum:
                        return 28;
                    case actual_maximum:
                        return days_in_month(tm_.tm_year + 1900,tm_.tm_mon + 1);
                    case current:
                        return tm_.tm_mday;
                    };
                    break;
                case day_of_year:                ///< The number of day in year, starting from 1
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 366;
                    case least_maximum:
                        return 365;
                    case actual_maximum:
                        return is_leap(tm_.tm_year + 1900) ? 366 : 365;
                    case current:
                        return tm_.tm_yday + 1;
                    }
                    break;
                case day_of_week:                ///< Day of week, starting from Sunday, [1..7]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 7;
                    case current:
                        return tm_.tm_wday + 1;
                    }
                    break;
                case day_of_week_local:     ///< Local day of week, for example in France Monday is 1, in US Sunday is 1, [1..7]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 7;
                    case current:
                        return (tm_.tm_wday - first_day_of_week_ + 7) % 7 + 1;
                    }
                    break;
                case hour:                       ///< 24 clock hour [0..23]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 23;
                    case current:
                        return tm_.tm_hour;
                    }
                    break;
                case hour_12:                    ///< 12 clock hour [0..11]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 11;
                    case current:
                        return tm_.tm_hour % 12;
                    }
                    break;
                case am_pm:                      ///< am or pm marker, [0..1]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 1;
                    case current:
                        return tm_.tm_hour >= 12 ? 1 : 0;
                    }
                    break;
                case minute:                     ///< minute [0..59]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 59;
                    case current:
                        return tm_.tm_min;
                    }
                    break;
                case second:                     ///< second [0..59]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 59;
                    case current:
                        return tm_.tm_sec;
                    }
                    break;
                case period::marks::first_day_of_week:          ///< For example Sunday in US, Monday in France
                    return first_day_of_week_ + 1;
                
                case week_of_year:               ///< The week number in the year
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 53;
                    case least_maximum:
                        return 52;
                    case actual_maximum:
                        {
                            int year = tm_.tm_year + 1900;
                            int end_of_year_days = (is_leap(year) ? 366 : 365) - 1;
                            int dow_of_end_of_year = (end_of_year_days - tm_.tm_yday + tm_.tm_wday) % 7;
                            return get_week_number(end_of_year_days,dow_of_end_of_year);
                        }
                    case current:
                        {
                            int val = get_week_number(tm_.tm_yday,tm_.tm_wday);
                            if(val < 0)
                                return 53;
                            return val;
                        }
                    }
                case week_of_month:              ///< The week number withing current month
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 5;
                    case least_maximum:
                        return 4;
                    case actual_maximum:
                        {
                            int end_of_month_days = days_in_month(tm_.tm_year + 1900,tm_.tm_mon + 1);
                            int dow_of_end_of_month = (end_of_month_days - tm_.tm_mday + tm_.tm_wday) % 7;
                            return get_week_number(end_of_month_days,dow_of_end_of_month);
                        }
                    case current:
                        {
                            int val = get_week_number(tm_.tm_mday,tm_.tm_wday);
                            if(val < 0)
                                return 5;
                            return val;
                        }
                    }

                case day_of_week_in_month:       ///< Original number of the day of the week in month.
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 5;
                    case least_maximum:
                        return 4;
                    case actual_maximum:
                        if(tm_.tm_mon == 1 && !is_leap(tm_.tm_year + 1900)) {
                            // only in february in non leap year is 28 days, the rest
                            // conver more then 4 weeks
                            return 4;
                        }
                        return 5;
                    case current:
                        return (tm_.tm_mday - 1) / 7 + 1;
                    default:
                        ;
                    }
                default:
                    ;
                }
                return 0;
 
            }